

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.c
# Opt level: O2

int main(void)

{
  float fVar1;
  uint class_size;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint i;
  long lVar8;
  undefined1 *puVar9;
  char *pcVar10;
  uint i_1;
  ulong uVar11;
  uint j;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uStackY_10d0;
  char *pcVar18;
  undefined1 local_10b8 [8];
  small_class sc;
  undefined1 local_1078 [4108];
  undefined1 local_6c [8];
  small_class sc_1;
  
  plan(3);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  uVar12 = 1;
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","test_class");
  small_class_create((small_class *)local_10b8,2,1.2,0xc,(float *)local_6c);
  uVar2 = small_class_calc_offset_by_size((small_class *)local_10b8,0);
  uVar3 = small_class_calc_size_by_offset((small_class *)local_10b8,uVar2);
  do {
    if (uVar12 == 0x65) {
      lVar14 = 0;
      uVar12 = 1;
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_class.c",
          0x3e,"line %d",0x3e);
      _space(_stdout);
      printf("# *** %s: done ***\n","test_class");
      check_plan();
      plan(4);
      _space(_stdout);
      printf("# *** %s ***\n","check_expectation");
      do {
        if (lVar14 == 4) {
          _space(_stdout);
          printf("# *** %s: done ***\n","check_expectation");
          check_plan();
          plan(1);
          _space(_stdout);
          printf("# *** %s ***\n","check_factor");
          do {
            if (4 < uVar12) {
              _ok(1,"true",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_class.c"
                  ,0xa2,"line %d",0xa2);
              _space(_stdout);
              printf("# *** %s: done ***\n","check_factor");
              check_plan();
              _space(_stdout);
              printf("# *** %s: done ***\n","main");
              iVar5 = check_plan();
              return iVar5;
            }
            fVar17 = 1.01;
            while ((double)fVar17 < 1.995) {
              unique0x100005ea = (double)fVar17;
              small_class_create((small_class *)local_10b8,uVar12,fVar17,uVar12,(float *)local_6c);
              fVar15 = powf(fVar17,0.5);
              uVar2 = sc.size_shift;
              if (((float)sc.size_shift < fVar17 / fVar15) ||
                 (fVar17 * fVar15 < (float)sc.size_shift)) {
                pcVar18 = "check_factor";
                pcVar10 = "sc.actual_factor >= factor / k && sc.actual_factor <= factor * k";
                uStackY_10d0 = 0x8f;
                goto LAB_0010175c;
              }
              uVar3 = sc.ignore_bits_count * 3;
              fVar15 = 1.0;
              uVar4 = sc.ignore_bits_count;
              fVar17 = fVar15;
              while (fVar16 = fVar17, uVar4 < uVar3) {
                uVar6 = small_class_calc_size_by_offset((small_class *)local_10b8,uVar4);
                uVar4 = uVar4 + 1;
                uVar7 = small_class_calc_size_by_offset((small_class *)local_10b8,uVar4);
                fVar17 = (float)uVar2 / ((float)uVar7 / (float)uVar6);
                fVar1 = fVar17;
                if (fVar15 <= fVar17) {
                  fVar1 = fVar15;
                }
                fVar15 = fVar1;
                if (fVar17 <= fVar16) {
                  fVar17 = fVar16;
                }
              }
              if ((fVar15 <= 0.6931472) || (1.3862944 <= fVar16)) {
                pcVar18 = "check_factor";
                pcVar10 = "min_deviation > ln2 && max_deviation < 2 * ln2";
                uStackY_10d0 = 0x9f;
                goto LAB_0010175c;
              }
              fVar17 = (float)(stack0xffffffffffffffb8 + 0.01);
            }
            uVar12 = uVar12 << 2;
          } while( true );
        }
        uVar2 = (&DAT_00102210)[lVar14];
        iVar5 = rand();
        uVar13 = (long)iVar5 % 0x10 & 0xffffffff;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          uVar3 = (int)uVar13 + uVar2;
          uVar13 = (ulong)uVar3;
          *(uint *)(local_10b8 + lVar8 * 4) = uVar3;
        }
        puVar9 = local_1078;
        uVar3 = uVar2;
        for (uVar11 = 0x10; uVar11 < 0x400; uVar11 = uVar11 + 0x10) {
          for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
            uVar4 = (int)uVar13 + uVar3;
            uVar13 = (ulong)uVar4;
            *(uint *)(puVar9 + lVar8 * 4) = uVar4;
          }
          uVar3 = uVar3 * 2;
          puVar9 = puVar9 + 0x40;
        }
        small_class_create((small_class *)local_6c,uVar2,1.05,(int)((long)iVar5 % 0x10) + uVar2,
                           (float *)&sc_1.size_shift_plus_1);
        uVar2 = 0;
        _ok((uint)(sc_1.ignore_bits_count == 0x10),"sc.effective_size == eff_size",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_class.c"
            ,0x71,"line %d",0x71);
        while (uVar2 != 0x401) {
          for (uVar13 = 0; uVar13 != 0x400; uVar13 = uVar13 + 1) {
            if (uVar2 <= *(uint *)(local_10b8 + uVar13 * 4)) goto LAB_0010143d;
          }
          uVar13 = 0x400;
LAB_0010143d:
          uVar3 = small_class_calc_offset_by_size((small_class *)local_6c,uVar2);
          if (uVar3 != (uint)uVar13) {
            pcVar18 = "check_expectation";
            pcVar10 = "got_class == expect_class";
            uStackY_10d0 = 0x7a;
            goto LAB_0010175c;
          }
          uVar3 = small_class_calc_size_by_offset((small_class *)local_6c,(uint)uVar13);
          uVar2 = uVar2 + 1;
          if (uVar3 != *(uint *)(local_10b8 + (uVar13 & 0xffffffff) * 4)) {
            pcVar18 = "check_expectation";
            pcVar10 = "got_class_size == expect_class_size";
            uStackY_10d0 = 0x7b;
            goto LAB_0010175c;
          }
        }
        lVar14 = lVar14 + 1;
      } while( true );
    }
    uVar4 = small_class_calc_offset_by_size((small_class *)local_10b8,uVar12);
    if (uVar4 != uVar2 && uVar12 <= uVar3) {
      pcVar18 = "test_class";
      pcVar10 = "cls == class";
      uStackY_10d0 = 0x37;
      goto LAB_0010175c;
    }
    if (uVar12 == uVar3 + 1) {
      if (uVar4 != uVar2 + 1) {
        pcVar18 = "test_class";
        pcVar10 = "cls == class + 1";
        uStackY_10d0 = 0x39;
LAB_0010175c:
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar10,"false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_class.c"
                ,uStackY_10d0,pcVar18);
        exit(-1);
      }
      uVar3 = small_class_calc_size_by_offset((small_class *)local_10b8,uVar4);
      uVar2 = uVar4;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

int
main(void)
{
	plan(3);
	header();

	test_class();
	check_expectation();
	check_factor();

	footer();
	return check_plan();
}